

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

string * __thiscall
JSON::JSONValue::toString_abi_cxx11_(string *__return_storage_ptr__,JSONValue *this,int indent)

{
  string *psVar1;
  JSONObject *this_00;
  JSONArray *arr;
  bool *pbVar2;
  char *pcVar3;
  size_t i;
  ulong uVar4;
  double dVar5;
  string toprint;
  stringstream out;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  switch(this->type) {
  case STRING:
    psVar1 = getStringValue_abi_cxx11_(this);
    std::__cxx11::string::string((string *)&local_1d0,(string *)psVar1);
    std::operator<<(local_1a0,"\"");
    for (uVar4 = 0; uVar4 < local_1d0._M_string_length; uVar4 = uVar4 + 1) {
      if (local_1d0._M_dataplus._M_p[uVar4] == '\"') {
        std::operator<<(local_1a0,"\\\"");
      }
      else {
        std::operator<<(local_1a0,local_1d0._M_dataplus._M_p[uVar4]);
      }
    }
    std::operator<<(local_1a0,"\"");
    goto LAB_0010a6e5;
  case INTEGER:
    getIntValue(this);
    std::ostream::_M_insert<long_long>((longlong)local_1a0);
    break;
  case DOUBLE:
    dVar5 = getDoubleValue(this);
    std::ostream::_M_insert<double>(dVar5);
    break;
  case ARRAY:
    arr = getArrayValue(this);
    operator<<(local_1a0,arr);
    break;
  case OBJECT:
    this_00 = getObjectValue(this);
    JSONObject::toString_abi_cxx11_(&local_1d0,this_00,indent + 2);
    std::operator<<(local_1a0,(string *)&local_1d0);
LAB_0010a6e5:
    std::__cxx11::string::~string((string *)&local_1d0);
    break;
  case BOOLEAN:
    pbVar2 = getBoolValue(this);
    pcVar3 = "false";
    if (*pbVar2 != false) {
      pcVar3 = "true";
    }
    goto LAB_0010a6cf;
  case JSONNULL:
    pcVar3 = "null";
LAB_0010a6cf:
    std::operator<<(local_1a0,pcVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

string JSONValue::toString(int indent) const {
	stringstream out;
	switch(getType()) {
		case STRING:
			{
				string toprint=getStringValue();
				out << "\"";
				for(size_t i=0;i<toprint.size();i++)
					if(toprint[i]=='"')
						out << "\\\"";
					else
						out << toprint[i];
				out << "\"";
				break;
			}
		case INTEGER:
			out << getIntValue();
			break;
		case DOUBLE:
			out << getDoubleValue();
			break;
		case ARRAY:
			out << getArrayValue();
			break;
		case OBJECT:
			out << getObjectValue().toString(indent+2);
			break;
		case BOOLEAN:
			if(getBoolValue()==true)
				out << "true";
			else
				out << "false";
			break;
		case JSONNULL:
			out << "null";
			break;
	}
	return out.str();
}